

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

bool anon_unknown.dwarf_263bcb::RenderTargetImpl::isActive(Uint64 id)

{
  iterator iVar1;
  bool bVar2;
  Uint64 local_10;
  
  local_10 = sf::Context::getActiveContextId();
  iVar1 = std::
          _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_unsigned_long_long>,_std::_Select1st<std::pair<const_unsigned_long_long,_unsigned_long_long>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
          ::find((_Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_unsigned_long_long>,_std::_Select1st<std::pair<const_unsigned_long_long,_unsigned_long_long>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_long_long>_>_>
                  *)(anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap,&local_10);
  if (iVar1._M_node ==
      (_Base_ptr)((anonymous_namespace)::RenderTargetImpl::contextRenderTargetMap + 8)) {
    bVar2 = false;
  }
  else {
    bVar2 = iVar1._M_node[1]._M_parent == (_Base_ptr)id;
  }
  return bVar2;
}

Assistant:

bool isActive(sf::Uint64 id)
        {
            ContextRenderTargetMap::iterator iter = contextRenderTargetMap.find(sf::Context::getActiveContextId());

            if ((iter == contextRenderTargetMap.end()) || (iter->second != id))
                return false;

            return true;
        }